

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O3

float noise_pink(noise_segment_data *data)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  
  uVar2 = data->pink_index + 1U & data->pink_index_mask;
  data->pink_index = uVar2;
  if (uVar2 != 0) {
    lVar4 = 0;
    uVar1 = uVar2 & 1;
    while (uVar1 == 0) {
      lVar4 = lVar4 + 1;
      uVar1 = uVar2 & 2;
      uVar2 = (int)uVar2 >> 1;
    }
    data->pink_running_sum = data->pink_running_sum - data->pink_rows[lVar4];
    fVar5 = mixed_random();
    lVar3 = (long)((fVar5 + -0.5) * 67108864.0);
    data->pink_running_sum = data->pink_running_sum + lVar3;
    data->pink_rows[lVar4] = lVar3;
  }
  fVar5 = mixed_random();
  return (float)((long)((fVar5 + -0.5) * 67108864.0) + data->pink_running_sum) * data->pink_scalar;
}

Assistant:

float noise_pink(struct noise_segment_data *data){
  int64_t random;
  int64_t sum;

  data->pink_index = (data->pink_index + 1) & data->pink_index_mask;

  if(data->pink_index != 0) {
    int zeroes = 0;
    int n = data->pink_index;
    while((n & 1) == 0){
      n = n >> 1;
      zeroes++;
    }

    data->pink_running_sum -= data->pink_rows[zeroes];
    random = (mixed_random()-0.5)*67108864;
    data->pink_running_sum += random;
    data->pink_rows[zeroes] = random;
  }
  
  random = (mixed_random()-0.5)*67108864;
  sum = data->pink_running_sum + random;

  return data->pink_scalar * sum;
}